

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::get_identifier
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text,size_t token_start,version ver)

{
  wchar_t *__end;
  bool bVar1;
  token_type tVar2;
  const_reference pvVar3;
  size_type sVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  const_iterator pvVar7;
  runtime_error *this_00;
  bool bVar8;
  code *local_a98;
  token local_a80;
  token local_a58;
  token local_a30;
  token local_a08;
  token local_9e0;
  token local_9b8;
  token local_990;
  token local_968;
  token local_940;
  token local_918;
  token local_8f0;
  token local_8c8;
  token local_8a0;
  token local_878;
  token local_850;
  token local_828;
  token local_800;
  token local_7d8;
  token local_7b0;
  token local_788;
  token local_760;
  token local_738;
  token local_710;
  token local_6e8;
  token local_6c0;
  token local_698;
  token local_670;
  token local_648;
  token local_620;
  token local_5f8;
  token local_5d0;
  token local_5a8;
  token local_580;
  token local_558;
  token local_530;
  token local_508;
  token local_4e0;
  token local_4b8;
  token local_490;
  token local_468;
  token local_440;
  token local_418;
  token local_3f0;
  token local_3c8;
  token local_3a0;
  token local_378;
  token local_350;
  token local_328;
  token local_300;
  token local_2d8;
  token local_2b0;
  token local_288;
  token local_260;
  token local_238;
  token local_210;
  token local_1e8;
  token local_1c0;
  token local_198;
  token local_170;
  token local_148;
  token local_120;
  token local_f8;
  wstring local_d0;
  undefined1 local_b0 [8];
  token tok;
  allocator<wchar_t> local_71;
  undefined1 local_70 [8];
  wstring id;
  int ch;
  _func_bool_int *exended_id_part;
  ulong uStack_38;
  bool escape_sequence_used;
  size_t token_end;
  wchar_t *pwStack_28;
  version ver_local;
  size_t token_start_local;
  wstring_view text_local;
  
  token_end._4_4_ = (version)token_start;
  pwStack_28 = text._M_str;
  text_local._M_len = text._M_len;
  uStack_38 = (long)pwStack_28 + 1;
  token_start_local = (size_t)this;
  text_local._M_str = (wchar_t *)__return_storage_ptr__;
  pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local,
                      (size_type)pwStack_28);
  bVar8 = *pvVar3 == 0x5c;
  if ((int)token_end._4_4_ < 2) {
    local_a98 = is_identifier_part_v3;
  }
  else {
    local_a98 = is_identifier_part_v5;
  }
  for (; uVar6 = uStack_38,
      sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                         &token_start_local), uVar6 < sVar4; uStack_38 = uStack_38 + 1) {
    pwVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local
                        ,uStack_38);
    id.field_2._M_local_buf[3] = *pwVar5;
    bVar1 = is_identifier_part_v1(id.field_2._M_local_buf[3]);
    if (!bVar1) {
      if ((int)token_end._4_4_ < 1) break;
      if (id.field_2._M_local_buf[3] == L'\\') {
        bVar8 = true;
      }
      else {
        uVar6 = (*local_a98)(id.field_2._M_local_buf[3]);
        if ((uVar6 & 1) == 0) break;
      }
    }
  }
  pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local);
  pwVar5 = pvVar7 + (long)pwStack_28;
  pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&token_start_local);
  __end = pvVar7 + uStack_38;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<wchar_t_const*,void>((wstring *)local_70,pwVar5,__end,&local_71);
  std::allocator<wchar_t>::~allocator(&local_71);
  token::token((token *)local_b0,eof);
  if (bVar8) {
    replace_unicode_escape_sequences(&local_d0,(wstring *)local_70,token_end._4_4_);
    std::__cxx11::wstring::operator=((wstring *)local_70,(wstring *)&local_d0);
    std::__cxx11::wstring::~wstring((wstring *)&local_d0);
  }
  if ((((int)token_end._4_4_ < 1) || (1 < (int)token_end._4_4_)) ||
     (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_70,L"abstract"), !bVar1)) {
    if ((((int)token_end._4_4_ < 1) || (1 < (int)token_end._4_4_)) ||
       (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)local_70,L"boolean"), !bVar1)) {
      if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
         (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)local_70,L"break"), !bVar1)) {
        if ((((int)token_end._4_4_ < 1) || (1 < (int)token_end._4_4_)) ||
           (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)local_70,L"byte"), !bVar1)) {
          if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
             (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)local_70,L"case"), !bVar1)) {
            if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
               (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)local_70,L"catch"), !bVar1)) {
              if ((((int)token_end._4_4_ < 1) || (1 < (int)token_end._4_4_)) ||
                 (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)local_70,L"char"), !bVar1)) {
                if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                   (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                             *)local_70,L"class"), !bVar1)) {
                  if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                     (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                               *)local_70,L"const"), !bVar1)) {
                    if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                       (bVar1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                 *)local_70,L"continue"), !bVar1)) {
                      if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                         (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"debugger"), !bVar1)) {
                        if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                           (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"default"), !bVar1)) {
                          if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                             (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"delete"), !bVar1)) {
                            if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                               (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"do"), !bVar1)) {
                              if ((((int)token_end._4_4_ < 1) || (1 < (int)token_end._4_4_)) ||
                                 (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"double"), !bVar1)) {
                                if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                                   (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"else"), !bVar1)) {
                                  if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_)) ||
                                     (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"enum"), !bVar1)) {
                                    if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_))
                                       || (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"export"), !bVar1)) {
                                      if ((((int)token_end._4_4_ < 0) || (2 < (int)token_end._4_4_))
                                         || (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"extends"), !bVar1)) {
                                        if ((((int)token_end._4_4_ < 0) ||
                                            (2 < (int)token_end._4_4_)) ||
                                           (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"false"), !bVar1)) {
                                          if ((((int)token_end._4_4_ < 1) ||
                                              (1 < (int)token_end._4_4_)) ||
                                             (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"final"), !bVar1)) {
                                            if ((((int)token_end._4_4_ < 0) ||
                                                (2 < (int)token_end._4_4_)) ||
                                               (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"finally"), !bVar1)) {
                                              if ((((int)token_end._4_4_ < 1) ||
                                                  (1 < (int)token_end._4_4_)) ||
                                                 (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"float"), !bVar1)) {
                                                if ((((int)token_end._4_4_ < 0) ||
                                                    (2 < (int)token_end._4_4_)) ||
                                                   (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"for"), !bVar1)) {
                                                  if ((((int)token_end._4_4_ < 0) ||
                                                      (2 < (int)token_end._4_4_)) ||
                                                     (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"function"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"goto"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"if"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"implements"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"import"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"in"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"instanceof"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"int"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"interface"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 2) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"let"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"long"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"native"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"new"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"null"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"package"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"private"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"protected"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"public"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"return"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"short"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"static"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"super"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"switch"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"synchronized"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"this"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"throw"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"throws"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"transient"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"true"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"try"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"typeof"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"var"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"void"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 1) ||
                                                        (1 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"volatile"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"while"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 0) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"with"), !bVar1)) {
                                                    if ((((int)token_end._4_4_ < 2) ||
                                                        (2 < (int)token_end._4_4_)) ||
                                                       (bVar1 = std::operator==((
                                                  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                                  *)local_70,L"yield"), !bVar1)) {
                                                    token::token(&local_a80,identifier,
                                                                 (wstring *)local_70);
                                                    token::operator=((token *)local_b0,&local_a80);
                                                    token::~token(&local_a80);
                                                  }
                                                  else {
                                                    token::token(&local_a58,yield_);
                                                    token::operator=((token *)local_b0,&local_a58);
                                                    token::~token(&local_a58);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_a30,with_);
                                                    token::operator=((token *)local_b0,&local_a30);
                                                    token::~token(&local_a30);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_a08,while_);
                                                    token::operator=((token *)local_b0,&local_a08);
                                                    token::~token(&local_a08);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_9e0,volatile_);
                                                    token::operator=((token *)local_b0,&local_9e0);
                                                    token::~token(&local_9e0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_9b8,void_);
                                                    token::operator=((token *)local_b0,&local_9b8);
                                                    token::~token(&local_9b8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_990,var_);
                                                    token::operator=((token *)local_b0,&local_990);
                                                    token::~token(&local_990);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_968,typeof_);
                                                    token::operator=((token *)local_b0,&local_968);
                                                    token::~token(&local_968);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_940,try_);
                                                    token::operator=((token *)local_b0,&local_940);
                                                    token::~token(&local_940);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_918,true_);
                                                    token::operator=((token *)local_b0,&local_918);
                                                    token::~token(&local_918);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_8f0,transient_);
                                                    token::operator=((token *)local_b0,&local_8f0);
                                                    token::~token(&local_8f0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_8c8,throws_);
                                                    token::operator=((token *)local_b0,&local_8c8);
                                                    token::~token(&local_8c8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_8a0,throw_);
                                                    token::operator=((token *)local_b0,&local_8a0);
                                                    token::~token(&local_8a0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_878,this_);
                                                    token::operator=((token *)local_b0,&local_878);
                                                    token::~token(&local_878);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_850,synchronized_);
                                                    token::operator=((token *)local_b0,&local_850);
                                                    token::~token(&local_850);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_828,switch_);
                                                    token::operator=((token *)local_b0,&local_828);
                                                    token::~token(&local_828);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_800,super_);
                                                    token::operator=((token *)local_b0,&local_800);
                                                    token::~token(&local_800);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_7d8,static_);
                                                    token::operator=((token *)local_b0,&local_7d8);
                                                    token::~token(&local_7d8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_7b0,short_);
                                                    token::operator=((token *)local_b0,&local_7b0);
                                                    token::~token(&local_7b0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_788,return_);
                                                    token::operator=((token *)local_b0,&local_788);
                                                    token::~token(&local_788);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_760,public_);
                                                    token::operator=((token *)local_b0,&local_760);
                                                    token::~token(&local_760);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_738,protected_);
                                                    token::operator=((token *)local_b0,&local_738);
                                                    token::~token(&local_738);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_710,private_);
                                                    token::operator=((token *)local_b0,&local_710);
                                                    token::~token(&local_710);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_6e8,package_);
                                                    token::operator=((token *)local_b0,&local_6e8);
                                                    token::~token(&local_6e8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_6c0,null_);
                                                    token::operator=((token *)local_b0,&local_6c0);
                                                    token::~token(&local_6c0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_698,new_);
                                                    token::operator=((token *)local_b0,&local_698);
                                                    token::~token(&local_698);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_670,native_);
                                                    token::operator=((token *)local_b0,&local_670);
                                                    token::~token(&local_670);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_648,long_);
                                                    token::operator=((token *)local_b0,&local_648);
                                                    token::~token(&local_648);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_620,let_);
                                                    token::operator=((token *)local_b0,&local_620);
                                                    token::~token(&local_620);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_5f8,interface_);
                                                    token::operator=((token *)local_b0,&local_5f8);
                                                    token::~token(&local_5f8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_5d0,int_);
                                                    token::operator=((token *)local_b0,&local_5d0);
                                                    token::~token(&local_5d0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_5a8,instanceof_);
                                                    token::operator=((token *)local_b0,&local_5a8);
                                                    token::~token(&local_5a8);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_580,in_);
                                                    token::operator=((token *)local_b0,&local_580);
                                                    token::~token(&local_580);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_558,import_);
                                                    token::operator=((token *)local_b0,&local_558);
                                                    token::~token(&local_558);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_530,implements_);
                                                    token::operator=((token *)local_b0,&local_530);
                                                    token::~token(&local_530);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_508,if_);
                                                    token::operator=((token *)local_b0,&local_508);
                                                    token::~token(&local_508);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_4e0,goto_);
                                                    token::operator=((token *)local_b0,&local_4e0);
                                                    token::~token(&local_4e0);
                                                  }
                                                  }
                                                  else {
                                                    token::token(&local_4b8,function_);
                                                    token::operator=((token *)local_b0,&local_4b8);
                                                    token::~token(&local_4b8);
                                                  }
                                                }
                                                else {
                                                  token::token(&local_490,for_);
                                                  token::operator=((token *)local_b0,&local_490);
                                                  token::~token(&local_490);
                                                }
                                              }
                                              else {
                                                token::token(&local_468,float_);
                                                token::operator=((token *)local_b0,&local_468);
                                                token::~token(&local_468);
                                              }
                                            }
                                            else {
                                              token::token(&local_440,finally_);
                                              token::operator=((token *)local_b0,&local_440);
                                              token::~token(&local_440);
                                            }
                                          }
                                          else {
                                            token::token(&local_418,final_);
                                            token::operator=((token *)local_b0,&local_418);
                                            token::~token(&local_418);
                                          }
                                        }
                                        else {
                                          token::token(&local_3f0,false_);
                                          token::operator=((token *)local_b0,&local_3f0);
                                          token::~token(&local_3f0);
                                        }
                                      }
                                      else {
                                        token::token(&local_3c8,extends_);
                                        token::operator=((token *)local_b0,&local_3c8);
                                        token::~token(&local_3c8);
                                      }
                                    }
                                    else {
                                      token::token(&local_3a0,export_);
                                      token::operator=((token *)local_b0,&local_3a0);
                                      token::~token(&local_3a0);
                                    }
                                  }
                                  else {
                                    token::token(&local_378,enum_);
                                    token::operator=((token *)local_b0,&local_378);
                                    token::~token(&local_378);
                                  }
                                }
                                else {
                                  token::token(&local_350,else_);
                                  token::operator=((token *)local_b0,&local_350);
                                  token::~token(&local_350);
                                }
                              }
                              else {
                                token::token(&local_328,double_);
                                token::operator=((token *)local_b0,&local_328);
                                token::~token(&local_328);
                              }
                            }
                            else {
                              token::token(&local_300,do_);
                              token::operator=((token *)local_b0,&local_300);
                              token::~token(&local_300);
                            }
                          }
                          else {
                            token::token(&local_2d8,delete_);
                            token::operator=((token *)local_b0,&local_2d8);
                            token::~token(&local_2d8);
                          }
                        }
                        else {
                          token::token(&local_2b0,default_);
                          token::operator=((token *)local_b0,&local_2b0);
                          token::~token(&local_2b0);
                        }
                      }
                      else {
                        token::token(&local_288,debugger_);
                        token::operator=((token *)local_b0,&local_288);
                        token::~token(&local_288);
                      }
                    }
                    else {
                      token::token(&local_260,continue_);
                      token::operator=((token *)local_b0,&local_260);
                      token::~token(&local_260);
                    }
                  }
                  else {
                    token::token(&local_238,const_);
                    token::operator=((token *)local_b0,&local_238);
                    token::~token(&local_238);
                  }
                }
                else {
                  token::token(&local_210,class_);
                  token::operator=((token *)local_b0,&local_210);
                  token::~token(&local_210);
                }
              }
              else {
                token::token(&local_1e8,char_);
                token::operator=((token *)local_b0,&local_1e8);
                token::~token(&local_1e8);
              }
            }
            else {
              token::token(&local_1c0,catch_);
              token::operator=((token *)local_b0,&local_1c0);
              token::~token(&local_1c0);
            }
          }
          else {
            token::token(&local_198,case_);
            token::operator=((token *)local_b0,&local_198);
            token::~token(&local_198);
          }
        }
        else {
          token::token(&local_170,byte_);
          token::operator=((token *)local_b0,&local_170);
          token::~token(&local_170);
        }
      }
      else {
        token::token(&local_148,break_);
        token::operator=((token *)local_b0,&local_148);
        token::~token(&local_148);
      }
    }
    else {
      token::token(&local_120,boolean_);
      token::operator=((token *)local_b0,&local_120);
      token::~token(&local_120);
    }
  }
  else {
    token::token(&local_f8,abstract_);
    token::operator=((token *)local_b0,&local_f8);
    token::~token(&local_f8);
  }
  if ((bVar8) && (tVar2 = token::type((token *)local_b0), tVar2 != identifier)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unicode escape sequence used in keyword");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::pair<mjs::token,_unsigned_long>::pair<mjs::token_&,_unsigned_long_&,_true>
            (__return_storage_ptr__,(token *)local_b0,&stack0xffffffffffffffc8);
  token::~token((token *)local_b0);
  std::__cxx11::wstring::~wstring((wstring *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::pair<token, size_t> get_identifier(const std::wstring_view text, const size_t token_start, version ver) {
    auto token_end = token_start + 1;
    bool escape_sequence_used = text[token_start] == '\\';

    const auto exended_id_part = ver >= version::es5 ? is_identifier_part_v5 : is_identifier_part_v3;

    for (; token_end < text.size(); ++token_end) {
        const int ch = text[token_end];
        if (is_identifier_part_v1(ch)) {
            // OK - fast path
        } else if (ver < version::es3) {
            break;
        } else if (ch == '\\') {
            escape_sequence_used = true;
        } else if (!exended_id_part(ch)) {
            break;
        }
    }
    auto id = std::wstring{text.begin() + token_start, text.begin() + token_end};
    token tok{token_type::eof};
    if (escape_sequence_used) {
        id = replace_unicode_escape_sequences(id, ver);
    }
    if (0) {}
#define X(rw, first_ver, last_ver) else if (ver >= version::first_ver && ver <= version::last_ver && id == L ## #rw) { tok = token{token_type::rw ## _}; }
    MJS_KEYWORDS(X)
#undef X
else tok = token{token_type::identifier, id};

    if (escape_sequence_used && tok.type() != token_type::identifier) {
        throw std::runtime_error("Unicode escape sequence used in keyword");
    }

    return { tok, token_end };
}